

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

int GetMacroArgumentValue(char **src,char **dst)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *badValueMessage;
  EDelimiterType EVar4;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  array<EDelimiterType,_3UL> delimiters;
  
  SkipBlanks(src);
  pcVar3 = *dst;
  badValueMessage = *src;
  pcVar5 = badValueMessage;
  pcVar7 = pcVar3;
  do {
    while( true ) {
      if ((*pcVar5 == '\0') || (*pcVar5 == ',')) {
        pcVar5 = *dst;
        while ((pcVar7 < pcVar5 && ((byte)(pcVar5[-1] - 1U) < 0x20))) {
          pcVar5 = pcVar5 + -1;
          *dst = pcVar5;
        }
        *pcVar5 = '\0';
        if (*pcVar3 == '\0') {
          Warning("[Macro argument parser] empty value",badValueMessage,W_PASS3);
        }
        return 1;
      }
      delimiters._M_elems[2] = (badValueMessage != pcVar5) + DT_ANGLE;
      delimiters._M_elems[0] = DT_QUOTES;
      delimiters._M_elems[1] = DT_APOSTROPHE;
      EVar4 = DelimiterBegins(src,delimiters,false);
      if (EVar4 != DT_NONE) break;
      pcVar5 = *src;
LAB_001219b5:
      *src = pcVar5 + 1;
      cVar1 = *pcVar5;
      pcVar5 = *dst;
      *dst = pcVar5 + 1;
      *pcVar5 = cVar1;
      pcVar5 = *src;
    }
    if (EVar4 == DT_APOSTROPHE) {
      pcVar5 = *src;
      if (((badValueMessage < pcVar5) &&
          ((byte)((pcVar5[-1] | 0x20U) - 0x30) < 10 || (byte)((pcVar5[-1] | 0x20U) + 0x9f) < 6)) &&
         ((byte)((pcVar5[1] | 0x20U) - 0x30) < 10 || (byte)((pcVar5[1] | 0x20U) + 0x9f) < 6))
      goto LAB_001219b5;
LAB_001219dd:
      cVar1 = *pcVar5;
      pcVar5 = *dst;
      *dst = pcVar5 + 1;
      *pcVar5 = cVar1;
    }
    else if (EVar4 != DT_ANGLE) {
      pcVar5 = *src;
      goto LAB_001219dd;
    }
    pcVar5 = *src + 1;
    *src = pcVar5;
    cVar1 = " \"\'>"[EVar4];
    while (cVar6 = *pcVar5, cVar6 != '\0') {
      if (EVar4 == DT_QUOTES) {
        if (cVar6 == '\\') {
          if (pcVar5[1] != '\0') goto LAB_00121a5d;
          cVar6 = '\\';
        }
        goto LAB_00121a90;
      }
      if (EVar4 == DT_APOSTROPHE) {
        if ((cVar6 != '\'') || (cVar6 = '\'', pcVar5[1] != '\'')) goto LAB_00121a90;
LAB_00121a5d:
        *src = pcVar5 + 1;
        cVar6 = *pcVar5;
        pcVar5 = *dst;
        *dst = pcVar5 + 1;
        *pcVar5 = cVar6;
        pcVar5 = *src;
LAB_00121a94:
        *src = pcVar5 + 1;
        cVar6 = *pcVar5;
        pcVar5 = *dst;
        *dst = pcVar5 + 1;
        *pcVar5 = cVar6;
      }
      else {
        if (EVar4 != DT_ANGLE) {
          Error("Internal error. GetMacroArgumentValue()",(char *)0x0,FATAL);
          pcVar5 = *src;
          cVar6 = *pcVar5;
LAB_00121a90:
          if (cVar1 != cVar6) goto LAB_00121a94;
          goto LAB_00121abc;
        }
        if ((cVar6 != '!') || ((cVar2 = pcVar5[1], cVar2 != '>' && (cVar6 = '!', cVar2 != '!'))))
        goto LAB_00121a90;
        pcVar5 = *dst;
        *dst = pcVar5 + 1;
        *pcVar5 = cVar2;
        *src = *src + 2;
      }
      pcVar5 = *src;
    }
    if (EVar4 != DT_COUNT) {
      **dst = '\0';
      return 0;
    }
LAB_00121abc:
    if (EVar4 < DT_ANGLE) {
      pcVar5 = *dst;
      *dst = pcVar5 + 1;
      *pcVar5 = cVar1;
      pcVar5 = *src;
    }
    pcVar7 = *dst;
    pcVar5 = pcVar5 + 1;
    *src = pcVar5;
  } while( true );
}

Assistant:

int GetMacroArgumentValue(char* & src, char* & dst) {
	SkipBlanks(src);
	const char* const dstOrig = dst, * const srcOrig = src;
	const char* dstStopTrim = dst;
	while (*src && ',' != *src) {
		// check if there is some kind of delimiter next (string literal or angle brackets expression)
		// the angle-bracket can only be used around whole argument (i.e. '<' must be first char)
		EDelimiterType delI = DelimiterBegins(src, srcOrig==src ? delimiters_all : delimiters_noAngle, false);
		// CPP numeric literals heuristic (eating digit-group apostrophes as regular digit char)
		if (DT_APOSTROPHE == delI && srcOrig < src) {
			const char prevC = 0x20 | src[-1];	// also lowercase any ASCII letter
			if (('0' <= prevC && prevC <= '9') || ('a' <= prevC && prevC <= 'f')) {
				// ahead of apostrophe is character which can work as digit (up to hexa system)
				// this heuristic doesn't bother to be super precise, because string-apostrophe
				// should be on word boundary any way, not preceded by *any* digit of any base.
				const char nextC = 0x20 | src[1];
				if (('0' <= nextC && nextC <= '9') || ('a' <= nextC && nextC <= 'f')) {
					// by same logic, if also char after the apostrophe is any digit (up to base16)
					// turn the apostrophe from delimiter into digit-grouping char
					delI = DT_NONE;
				}
			}
		}
		if (DT_NONE == delI) {		// no delimiter found, ordinary expression, copy char by char
			*dst++ = *src++;
			continue;
		}
		// some delimiter found - parse those properly by their type
		if (DT_ANGLE != delI) *dst++ = *src;	// quotes are part of parsed value, angles are NOT
		++src;									// advance over delimiter
		const char endCh = delimiters_e[delI];	// set expected ending delimiter
		while (*src) {
			// handle escape sequences by the type of delimiter
			switch (delI) {
			case DT_ANGLE:
				if (('!' == *src && '!' == src[1]) || ('!' == *src && '>' == src[1])) {
					*dst++ = src[1]; src += 2;	// escape sequence is converted into final char
					continue;
				}
				break;
			case DT_QUOTES:
				if ('\\' == *src && src[1]) {
					*dst++ = *src++;	*dst++ = *src++;
					continue;					// copy escape + escaped char (*any* non zero char)
				}
				break;
			case DT_APOSTROPHE:
				if ('\'' == *src && '\'' == src[1]) {
					*dst++ = *src++;	*dst++ = *src++;
					continue;					// copy two apostrophes (escaped apostrophe)
				}
				break;
			default:	Error("Internal error. GetMacroArgumentValue()", NULL, FATAL);
			}
			if (endCh == *src) break;			// ending delimiter found
			*dst++ = *src++;					// just copy character
		}
		// ending delimiter must be identical to endCh
		if (endCh != *src) {
			*dst = 0;							// zero terminator of resulting string value
			return 0;
		}
		// set ending delimiter for quotes and apostrophe (angles are stripped from value)
		if (DT_QUOTES == delI || DT_APOSTROPHE == delI) *dst++ = endCh;
		dstStopTrim = dst;						// should not trim right spaces beyond this point
		++src;									// advance over delimiter
	}
	while (dstStopTrim < dst && White(dst[-1])) --dst;	// trim the right size space from value
	*dst = 0;									// zero terminator of resulting string value
	if (! *dstOrig) Warning("[Macro argument parser] empty value", srcOrig);
	return 1;
}